

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::CountBitsFunction::eval
          (CountBitsFunction *this,EvalContext *context,Args *args,SourceRange range,
          SystemCallInfo *param_5)

{
  bool bVar1;
  logic_t lVar2;
  SVInt *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  EvalContext *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  logic_t bit;
  ConstantValue v;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  SVInt *iv;
  uint64_t count;
  bool seen [4];
  ConstantValue value;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined4 in_stack_fffffffffffffe80;
  bitwidth_t in_stack_fffffffffffffe84;
  bitwidth_t in_stack_fffffffffffffe88;
  bitwidth_t in_stack_fffffffffffffe8c;
  bitwidth_t in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  ConstantValue *value_00;
  SourceRange in_stack_fffffffffffffed0;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_e0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_d8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_c8;
  SVInt *local_c0;
  long local_b8;
  undefined4 local_ac;
  int local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  ConstantValue local_80 [2];
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = in_R8;
  uStack_10 = in_R9;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  value_00 = local_80;
  Expression::eval((Expression *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (EvalContext *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_98 = local_18;
  uStack_90 = uStack_10;
  Bitstream::convertToBitVector(value_00,in_stack_fffffffffffffed0,in_RDI);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x8e01a3);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8e01b0);
  if (bVar1) {
    local_ac = 0;
    local_b8 = 0;
    local_c0 = slang::ConstantValue::integer((ConstantValue *)0x8e0243);
    local_d8 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    local_c8 = &local_d8;
    local_e0._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator*(&local_e0);
      Expression::eval((Expression *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (EvalContext *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80))
      ;
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8e0318);
      if (bVar1) {
        this_00 = slang::ConstantValue::integer((ConstantValue *)0x8e0375);
        lVar2 = SVInt::operator[]((SVInt *)value_00,(int32_t)((ulong)in_RDI >> 0x20));
        in_stack_fffffffffffffe94 = CONCAT13(lVar2.value,(int3)in_stack_fffffffffffffe94);
        if (lVar2.value == '\0') {
          if ((local_ac & 1) == 0) {
            in_stack_fffffffffffffe90 = SVInt::countZeros(this_00);
            local_b8 = (ulong)in_stack_fffffffffffffe90 + local_b8;
            local_ac = CONCAT31(local_ac._1_3_,1);
          }
        }
        else if (lVar2.value == '\x01') {
          if ((local_ac & 0x100) == 0) {
            in_stack_fffffffffffffe8c = SVInt::countOnes(this_00);
            local_b8 = (ulong)in_stack_fffffffffffffe8c + local_b8;
            local_ac._0_2_ = CONCAT11(1,(undefined1)local_ac);
          }
        }
        else if (lVar2.value == 0x80) {
          if ((local_ac & 0x10000) == 0) {
            in_stack_fffffffffffffe88 =
                 SVInt::countXs((SVInt *)CONCAT44(in_stack_fffffffffffffe8c,
                                                  in_stack_fffffffffffffe88));
            local_b8 = (ulong)in_stack_fffffffffffffe88 + local_b8;
            local_ac._0_3_ = CONCAT12(1,(undefined2)local_ac);
          }
        }
        else if ((lVar2.value == '@') && ((local_ac & 0x1000000) == 0)) {
          in_stack_fffffffffffffe84 =
               SVInt::countZs((SVInt *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                             );
          local_b8 = (ulong)in_stack_fffffffffffffe84 + local_b8;
          local_ac = CONCAT13(1,(undefined3)local_ac);
        }
        local_a8 = 0;
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (nullptr_t)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        local_a8 = 1;
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x8e04d5);
      if (local_a8 != 0) goto LAB_008e055c;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_e0);
    }
    SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe8c,
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (bool)in_stack_fffffffffffffe7f);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (SVInt *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_a8 = 1;
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (nullptr_t)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    local_a8 = 1;
  }
LAB_008e055c:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x8e0569);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange range,
                       const CallExpression::SystemCallInfo&) const final {
        auto value = Bitstream::convertToBitVector(args[0]->eval(context), range, context);
        if (!value)
            return nullptr;

        // Figure out which bit values we're checking -- the caller can
        // pass any number of arguments; we always take the LSB and compare
        // that against all bits, counting each one that matches.
        //
        // This array tracks which bit values we've already counted: 0, 1, X, or Z
        bool seen[4]{};
        uint64_t count = 0;
        const SVInt& iv = value.integer();

        for (auto arg : args.subspan(1)) {
            ConstantValue v = arg->eval(context);
            if (!v)
                return nullptr;

            logic_t bit = v.integer()[0];
            if (bit.value == 0) {
                if (!seen[0]) {
                    count += iv.countZeros();
                    seen[0] = true;
                }
            }
            else if (bit.value == 1) {
                if (!seen[1]) {
                    count += iv.countOnes();
                    seen[1] = true;
                }
            }
            else if (bit.value == logic_t::X_VALUE) {
                if (!seen[2]) {
                    count += iv.countXs();
                    seen[2] = true;
                }
            }
            else if (bit.value == logic_t::Z_VALUE) {
                if (!seen[3]) {
                    count += iv.countZs();
                    seen[3] = true;
                }
            }
        }

        return SVInt(32, count, true);
    }